

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shifter.cpp
# Opt level: O0

void __thiscall Storage::Encodings::MFM::Shifter::add_input_bit(Shifter *this,int value)

{
  short sVar1;
  Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false> *this_00;
  uint8_t uVar2;
  int value_local;
  Shifter *this_local;
  
  this->shift_register_ = this->shift_register_ << 1 | value;
  this->bits_since_token_ = this->bits_since_token_ + 1;
  this->token_ = None;
  if ((this->should_obey_syncs_ & 1U) != 0) {
    if ((this->is_mfm_ & 1U) == 0) {
      sVar1 = (short)this->shift_register_;
      if (sVar1 == -0xa96) {
        this->token_ = DeletedData;
        CRC::Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>::
        reset(&this->crc_generator_->
               super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
             );
        CRC::Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>::add
                  (&this->crc_generator_->
                    super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                   ,0xf8);
      }
      else if (sVar1 == -0xa91) {
        this->token_ = Data;
        CRC::Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>::
        reset(&this->crc_generator_->
               super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
             );
        CRC::Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>::add
                  (&this->crc_generator_->
                    super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                   ,0xfb);
      }
      else if (sVar1 == -0xa82) {
        this->token_ = ID;
        CRC::Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>::
        reset(&this->crc_generator_->
               super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
             );
        CRC::Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>::add
                  (&this->crc_generator_->
                    super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                   ,0xfe);
      }
      else if (sVar1 == -0x886) {
        this->token_ = Index;
        CRC::Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>::
        reset(&this->crc_generator_->
               super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
             );
        CRC::Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>::add
                  (&this->crc_generator_->
                    super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                   ,0xfc);
      }
    }
    else {
      sVar1 = (short)this->shift_register_;
      if (sVar1 == 0x4489) {
        this->bits_since_token_ = 0;
        this->is_awaiting_marker_value_ = true;
        CRC::Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>::
        set_value(&this->crc_generator_->
                   super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                  ,0xcdb4);
        this->token_ = Sync;
      }
      else if (sVar1 == 0x5224) {
        if ((this->bits_since_token_ & 1U) != 0) {
          this->shift_register_ = this->shift_register_ >> 1;
        }
        this->bits_since_token_ = 0;
        this->is_awaiting_marker_value_ = true;
        this->token_ = Sync;
      }
    }
    if (this->token_ != None) {
      this->bits_since_token_ = 0;
      return;
    }
  }
  if (this->bits_since_token_ == 0x10) {
    this->token_ = Byte;
    this->bits_since_token_ = 0;
    if (((this->is_awaiting_marker_value_ & 1U) != 0) && ((this->is_mfm_ & 1U) != 0)) {
      this->is_awaiting_marker_value_ = false;
      uVar2 = get_byte(this);
      switch(uVar2) {
      case 0xf8:
        this->token_ = DeletedData;
        break;
      default:
        break;
      case 0xfb:
        this->token_ = Data;
        break;
      case 0xfc:
        this->token_ = Index;
        break;
      case 0xfe:
        this->token_ = ID;
      }
    }
    this_00 = &this->crc_generator_->
               super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
    ;
    uVar2 = get_byte(this);
    CRC::Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>::add
              (this_00,uVar2);
  }
  return;
}

Assistant:

void Shifter::add_input_bit(int value) {
	shift_register_ = (shift_register_ << 1) | unsigned(value);
	++bits_since_token_;

	token_ = Token::None;
	if(should_obey_syncs_) {
		if(!is_mfm_) {
			switch(shift_register_ & 0xffff) {
				case Storage::Encodings::MFM::FMIndexAddressMark:
					token_ = Token::Index;
					crc_generator_->reset();
					crc_generator_->add(Storage::Encodings::MFM::IndexAddressByte);
				break;
				case Storage::Encodings::MFM::FMIDAddressMark:
					token_ = Token::ID;
					crc_generator_->reset();
					crc_generator_->add(Storage::Encodings::MFM::IDAddressByte);
				break;
				case Storage::Encodings::MFM::FMDataAddressMark:
					token_ = Token::Data;
					crc_generator_->reset();
					crc_generator_->add(Storage::Encodings::MFM::DataAddressByte);
				break;
				case Storage::Encodings::MFM::FMDeletedDataAddressMark:
					token_ = Token::DeletedData;
					crc_generator_->reset();
					crc_generator_->add(Storage::Encodings::MFM::DeletedDataAddressByte);
				break;
				default:
				break;
			}
		} else {
			switch(shift_register_ & 0xffff) {
				case Storage::Encodings::MFM::MFMIndexSync:
					// This models a bit of slightly weird WD behaviour;
					// if an index sync was detected where it wasn't expected,
					// the WD will resync but also may return the clock bits
					// rather than data bits as the next byte read, depending
					// on framing.
					//
					// TODO: make this optional, if ever a Shifter with
					// well-defined non-WD behaviour is needed.
					//
					// TODO: Verify WD behaviour.
					if(bits_since_token_&1) {
						shift_register_ >>= 1;
					}

					bits_since_token_ = 0;
					is_awaiting_marker_value_ = true;

					token_ = Token::Sync;
				break;
				case Storage::Encodings::MFM::MFMSync:
					bits_since_token_ = 0;
					is_awaiting_marker_value_ = true;
					crc_generator_->set_value(Storage::Encodings::MFM::MFMPostSyncCRCValue);

					token_ = Token::Sync;
				break;
				default:
				break;
			}
		}

		if(token_ != Token::None) {
			bits_since_token_ = 0;
			return;
		}
	}

	if(bits_since_token_ == 16) {
		token_ = Token::Byte;
		bits_since_token_ = 0;

		if(is_awaiting_marker_value_ && is_mfm_) {
			is_awaiting_marker_value_ = false;
			switch(get_byte()) {
				case Storage::Encodings::MFM::IndexAddressByte:
					token_ = Token::Index;
				break;
				case Storage::Encodings::MFM::IDAddressByte:
					token_ = Token::ID;
				break;
				case Storage::Encodings::MFM::DataAddressByte:
					token_ = Token::Data;
				break;
				case Storage::Encodings::MFM::DeletedDataAddressByte:
					token_ = Token::DeletedData;
				break;
				default: break;
			}
		}

		crc_generator_->add(get_byte());
	}
}